

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObject.cpp
# Opt level: O1

bool __thiscall GameObject::CheckCollision(GameObject *this,int x,int y,int radius)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  
  bVar7 = -1 < radius;
  if (bVar7) {
    iVar4 = (int)this->pos_y - radius;
    iVar5 = -radius;
    do {
      iVar1 = iVar5 + (int)this->pos_x;
      if (iVar1 == x && iVar4 == y) {
        return bVar7;
      }
      iVar3 = 0;
      do {
        iVar2 = iVar3;
        if (radius * -2 == iVar2) goto LAB_00104265;
        iVar3 = iVar2 + -1;
      } while ((iVar1 != x) || ((iVar4 - y) + 1 != iVar2));
      if (~radius - iVar3 < radius) {
        return bVar7;
      }
LAB_00104265:
      bVar6 = iVar5 != radius;
      bVar7 = iVar5 < radius;
      iVar5 = iVar5 + 1;
    } while (bVar6);
  }
  return bVar7;
}

Assistant:

bool GameObject::CheckCollision(int x, int y, int radius)
{

  //is pos X or pos Y inside the point/radius?
for(int i=-radius;i<=radius;i++)
  { 
    for(int j=-radius;j<=radius;j++)
    { 

      if((static_cast<int>(pos_x)+i ==  x) && (static_cast<int>(pos_y)+j == y))
      {
        return true;
      }
    }

  } 
/*   if(static_cast<int>(pos_x) ==  x && static_cast<int>(pos_y) == y) ||
      {
        return true;
      }
 */     
  return false;

}